

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaLoader::ResolveNodeInstances
          (ColladaLoader *this,ColladaParser *pParser,Node *pNode,
          vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>
          *resolved)

{
  NodeLibrary *this_00;
  key_type *pkVar1;
  iterator __position;
  NodeLibrary *pNVar2;
  const_iterator cVar3;
  Logger *this_01;
  key_type *__k;
  Node *nd;
  Node *local_1e8;
  ColladaParser *local_1e0;
  vector<Assimp::Collada::Node_const*,std::allocator<Assimp::Collada::Node_const*>> *local_1d8;
  ColladaLoader *local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e0 = pParser;
  local_1d0 = this;
  std::vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>::
  reserve(resolved,(long)(pNode->mNodeInstances).
                         super__Vector_base<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pNode->mNodeInstances).
                         super__Vector_base<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
  __k = &((pNode->mNodeInstances).
          super__Vector_base<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_>
          ._M_impl.super__Vector_impl_data._M_start)->mNode;
  pkVar1 = &((pNode->mNodeInstances).
             super__Vector_base<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_>
             ._M_impl.super__Vector_impl_data._M_finish)->mNode;
  if (__k != pkVar1) {
    this_00 = &local_1e0->mNodeLibrary;
    pNVar2 = &local_1e0->mNodeLibrary;
    local_1d8 = (vector<Assimp::Collada::Node_const*,std::allocator<Assimp::Collada::Node_const*>> *
                )resolved;
    do {
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>_>
              ::find(&this_00->_M_t,__k);
      if ((_Rb_tree_header *)cVar3._M_node == &(pNVar2->_M_t)._M_impl.super__Rb_tree_header) {
        local_1e8 = (Node *)0x0;
      }
      else {
        local_1e8 = *(Node **)(cVar3._M_node + 2);
      }
      if (local_1e8 == (Node *)0x0) {
        local_1e8 = FindNode(local_1d0,local_1e0->mRootNode,__k);
      }
      if (local_1e8 == (Node *)0x0) {
        this_01 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[56]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [56])"Collada: Unable to resolve reference to instanced node ");
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(__k->_M_dataplus)._M_p,__k->_M_string_length);
        std::__cxx11::stringbuf::str();
        Logger::error(this_01,(char *)local_1c8);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        resolved = (vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>
                    *)local_1d8;
      }
      else {
        __position._M_current = *(Node ***)((long)resolved + 8);
        if (__position._M_current == *(Node ***)((long)resolved + 0x10)) {
          std::vector<Assimp::Collada::Node_const*,std::allocator<Assimp::Collada::Node_const*>>::
          _M_realloc_insert<Assimp::Collada::Node_const*const&>
                    ((vector<Assimp::Collada::Node_const*,std::allocator<Assimp::Collada::Node_const*>>
                      *)resolved,__position,&local_1e8);
        }
        else {
          *__position._M_current = local_1e8;
          *(long *)((long)resolved + 8) = *(long *)((long)resolved + 8) + 8;
        }
      }
      __k = __k + 1;
    } while (__k != pkVar1);
  }
  return;
}

Assistant:

void ColladaLoader::ResolveNodeInstances(const ColladaParser& pParser, const Collada::Node* pNode,
    std::vector<const Collada::Node*>& resolved) {
    // reserve enough storage
    resolved.reserve(pNode->mNodeInstances.size());

    // ... and iterate through all nodes to be instanced as children of pNode
    for (const auto &nodeInst : pNode->mNodeInstances) {
        // find the corresponding node in the library
        const ColladaParser::NodeLibrary::const_iterator itt = pParser.mNodeLibrary.find(nodeInst.mNode);
        const Collada::Node* nd = itt == pParser.mNodeLibrary.end() ? NULL : (*itt).second;

        // FIX for http://sourceforge.net/tracker/?func=detail&aid=3054873&group_id=226462&atid=1067632
        // need to check for both name and ID to catch all. To avoid breaking valid files,
        // the workaround is only enabled when the first attempt to resolve the node has failed.
        if (nullptr == nd) {
            nd = FindNode(pParser.mRootNode, nodeInst.mNode);
        }
        if (nullptr == nd) {
            ASSIMP_LOG_ERROR_F("Collada: Unable to resolve reference to instanced node ", nodeInst.mNode);
        } else {
            //  attach this node to the list of children
            resolved.push_back(nd);
        }
    }
}